

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::drawHandles(XFormWidget *this)

{
  Mode MVar1;
  XFormWidget *this_local;
  
  MVar1 = this->mode;
  if (MVar1 == Translate) {
    drawTranslateHandles(this);
  }
  else if (MVar1 == Rotate) {
    drawRotateHandles(this);
  }
  else if (MVar1 == Scale) {
    drawScaleHandles(this);
  }
  return;
}

Assistant:

void XFormWidget::drawHandles() const
{
   switch( mode )
   {
      case Mode::Translate:
         drawTranslateHandles();
         break;
      case Mode::Rotate:
         drawRotateHandles();
         break;
      case Mode::Scale:
         drawScaleHandles();
         break;
      default:
         break;
   }
}